

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::clear
          (array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute> *this)

{
  SAttribute *pSVar1;
  long lVar2;
  SAttribute *this_00;
  array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute> *this_local;
  
  pSVar1 = this->data;
  if (pSVar1 != (SAttribute *)0x0) {
    lVar2 = *(long *)&pSVar1[-1].Value.allocated;
    this_00 = pSVar1 + lVar2;
    while (pSVar1 != this_00) {
      this_00 = this_00 + -1;
      irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute::~SAttribute(this_00);
    }
    operator_delete__(&pSVar1[-1].Value.allocated,lVar2 * 0x20 + 8);
  }
  this->data = (SAttribute *)0x0;
  this->used = 0;
  this->allocated = 0;
  this->is_sorted = true;
  return;
}

Assistant:

void clear()
	{
		delete [] data;
		data = 0;
		used = 0;
		allocated = 0;
		is_sorted = true;
	}